

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# board.cpp
# Opt level: O0

bool __thiscall uttt::IBoard::operator==(IBoard *this,IBoard *other)

{
  undefined8 uVar1;
  bool bVar2;
  int *in_RSI;
  int *in_RDI;
  IBoard vertical;
  IBoard rotated;
  array<short,_9UL> *in_stack_ffffffffffffffb8;
  array<short,_9UL> *__two;
  array<short,_9UL> *in_stack_ffffffffffffffc0;
  array<short,_9UL> *__one;
  char cStack_32;
  int local_30;
  IBoard *this_00;
  bool local_1;
  
  if (((*in_RDI == *in_RSI) &&
      (bVar2 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar2)) &&
     (*(char *)((long)in_RDI + 0x16) == *(char *)((long)in_RSI + 0x16))) {
    local_1 = true;
  }
  else {
    uVar1 = *(undefined8 *)in_RDI;
    this_00 = *(IBoard **)(in_RDI + 4);
    RotateClockWise90(this_00);
    local_30 = (int)uVar1;
    if (((local_30 == *in_RSI) &&
        (bVar2 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar2)) &&
       ((char)((ulong)this_00 >> 0x30) == *(char *)((long)in_RSI + 0x16))) {
      local_1 = true;
    }
    else {
      RotateClockWise90(this_00);
      if (((local_30 == *in_RSI) &&
          (bVar2 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar2)) &&
         ((char)((ulong)this_00 >> 0x30) == *(char *)((long)in_RSI + 0x16))) {
        local_1 = true;
      }
      else {
        RotateClockWise90(this_00);
        if (((local_30 == *in_RSI) &&
            (bVar2 = std::operator==(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8), bVar2))
           && ((char)((ulong)this_00 >> 0x30) == *(char *)((long)in_RSI + 0x16))) {
          local_1 = true;
        }
        else {
          __two = *(array<short,_9UL> **)in_RDI;
          __one = *(array<short,_9UL> **)(in_RDI + 2);
          uVar1 = *(undefined8 *)(in_RDI + 4);
          MirrorVertical(this_00);
          cStack_32 = (char)((ulong)uVar1 >> 0x30);
          if ((((int)__two == *in_RSI) && (bVar2 = std::operator==(__one,__two), bVar2)) &&
             (cStack_32 == *(char *)((long)in_RSI + 0x16))) {
            local_1 = true;
          }
          else {
            RotateClockWise90(this_00);
            if ((((int)__two == *in_RSI) && (bVar2 = std::operator==(__one,__two), bVar2)) &&
               (cStack_32 == *(char *)((long)in_RSI + 0x16))) {
              local_1 = true;
            }
            else {
              RotateClockWise90(this_00);
              if ((((int)__two == *in_RSI) && (bVar2 = std::operator==(__one,__two), bVar2)) &&
                 (cStack_32 == *(char *)((long)in_RSI + 0x16))) {
                local_1 = true;
              }
              else {
                RotateClockWise90(this_00);
                if ((((int)__two == *in_RSI) && (bVar2 = std::operator==(__one,__two), bVar2)) &&
                   (cStack_32 == *(char *)((long)in_RSI + 0x16))) {
                  local_1 = true;
                }
                else {
                  local_1 = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool
IBoard::operator==(const IBoard &other) const
{
    if (macro == other.macro && micro == other.micro && next == other.next)
        return true;
    IBoard rotated(*this);
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;
    rotated.RotateClockWise90();
    if (rotated.macro == other.macro && rotated.micro == other.micro && rotated.next == other.next)
        return true;

    IBoard vertical(*this);
    vertical.MirrorVertical();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    vertical.RotateClockWise90();
    if (vertical.macro == other.macro && vertical.micro == other.micro && vertical.next == other.next)
        return true;
    return false;
}